

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::basic_string_view<char,_std::char_traits<char>_>_>::Iterator::
Iterator(Iterator *this,Iterator *other)

{
  Iterator *other_local;
  Iterator *this_local;
  
  memset(this,0,8);
  ParamIteratorInterface<std::basic_string_view<char,_std::char_traits<char>_>_>::
  ParamIteratorInterface
            (&this->
              super_ParamIteratorInterface<std::basic_string_view<char,_std::char_traits<char>_>_>);
  (this->super_ParamIteratorInterface<std::basic_string_view<char,_std::char_traits<char>_>_>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_029c62e8;
  this->base_ = other->base_;
  (this->iterator_)._M_current = (other->iterator_)._M_current;
  std::
  unique_ptr<std::basic_string_view<char,std::char_traits<char>>const,std::default_delete<std::basic_string_view<char,std::char_traits<char>>const>>
  ::unique_ptr<std::default_delete<std::basic_string_view<char,std::char_traits<char>>const>,void>
            ((unique_ptr<std::basic_string_view<char,std::char_traits<char>>const,std::default_delete<std::basic_string_view<char,std::char_traits<char>>const>>
              *)&this->value_);
  return;
}

Assistant:

Iterator(const Iterator& other)
        // The explicit constructor call suppresses a false warning
        // emitted by gcc when supplied with the -Wextra option.
        : ParamIteratorInterface<T>(),
          base_(other.base_),
          iterator_(other.iterator_) {}